

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

bool __thiscall Parser::is_builtin_type(Parser *this)

{
  uint uVar1;
  
  if (this->tok->kind == Keyword) {
    uVar1 = this->tok->i;
    if ((((ulong)uVar1 < 0x3a) && ((0x300060808000f18U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
       ((uVar1 - 0x4a < 6 && ((0x29U >> (uVar1 - 0x4a & 0x1f) & 1) != 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool is_builtin_type() const {
    return (tok->kind == TokenKind::Keyword &&
            (tok->i == key_auto ||
             tok->i == key_bool ||
             tok->i == key_char ||
             tok->i == key_char8_t ||
             tok->i == key_char16_t ||
             tok->i == key_char32_t ||
             tok->i == key_double ||
             tok->i == key_float ||
             tok->i == key_int ||
             tok->i == key_long ||
             tok->i == key_short ||
             tok->i == key_signed ||
             tok->i == key_unsigned ||
             tok->i == key_void ||
             tok->i == key_wchar_t));
  }